

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nodes-common.cc
# Opt level: O3

Dim * __thiscall
cnn::PairwiseRankLoss::dim_forward
          (Dim *__return_storage_ptr__,PairwiseRankLoss *this,
          vector<cnn::Dim,_std::allocator<cnn::Dim>_> *xs)

{
  uint uVar1;
  pointer __s1;
  undefined8 uVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  int iVar5;
  invalid_argument *this_00;
  ostringstream s;
  string local_1c0 [32];
  ostringstream local_1a0 [376];
  
  __s1 = (xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
         super__Vector_impl_data._M_start;
  if ((long)(xs->super__Vector_base<cnn::Dim,_std::allocator<cnn::Dim>_>)._M_impl.
            super__Vector_impl_data._M_finish - (long)__s1 == 0x48) {
    uVar1 = __s1->nd;
    if ((uVar1 == __s1[1].nd) && (__s1->bd == __s1[1].bd)) {
      iVar5 = bcmp(__s1,__s1 + 1,(ulong)uVar1);
      if ((iVar5 == 0) && ((uVar1 - 1 < 2 && (__s1->d[0] == 1)))) {
        __return_storage_ptr__->bd = __s1->bd;
        uVar2 = *(undefined8 *)(__s1->d + 2);
        uVar3 = *(undefined8 *)(__s1->d + 4);
        uVar4 = *(undefined8 *)(__s1->d + 6);
        *(undefined8 *)__return_storage_ptr__->d = *(undefined8 *)__s1->d;
        *(undefined8 *)(__return_storage_ptr__->d + 2) = uVar2;
        *(undefined8 *)(__return_storage_ptr__->d + 4) = uVar3;
        *(undefined8 *)(__return_storage_ptr__->d + 6) = uVar4;
        return __return_storage_ptr__;
      }
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0,"Bad input dimensions in PairwiseRankLoss: ",0x2a);
  operator<<((ostream *)local_1a0,xs);
  this_00 = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::__cxx11::stringbuf::str();
  std::invalid_argument::invalid_argument(this_00,local_1c0);
  __cxa_throw(this_00,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

Dim PairwiseRankLoss::dim_forward(const vector<Dim>& xs) const {
  if (xs.size() != 2 ||
      xs[0] != xs[1] ||
      xs[0].rows() != 1 ||
      (xs[0].ndims() != 1 && xs[0].ndims() != 2)) {
    ostringstream s; s << "Bad input dimensions in PairwiseRankLoss: " << xs;
    throw std::invalid_argument(s.str());
  }
  return xs[0].bd >= xs[1].bd ? xs[0] : xs[1];
}